

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::Queue
          (Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *this,size_t capacity)

{
  undefined8 in_RSI;
  long in_RDI;
  
  std::mutex::mutex((mutex *)0x193c3d);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x28));
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = in_RSI;
  *(undefined1 *)(in_RDI + 0x68) = 0;
  std::
  deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::deque((deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
           *)0x193c77);
  std::
  deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
  ::deque((deque<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>,_std::allocator<std::unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>_>_>
           *)0x193c8a);
  return;
}

Assistant:

Queue(size_t capacity) :
      elements_(0),
      capacity_(capacity),
      closed_(false) {
  }